

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,cmNewLineStyle newLine)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  byte bVar2;
  BOM BVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined1 local_7c0 [8];
  string outLine;
  string inLine;
  undefined8 local_778;
  string local_770;
  undefined1 local_750 [8];
  ostringstream e;
  undefined1 local_5d0 [4];
  BOM bom;
  long local_5b0;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  ofstream fout;
  string tempOutputFile;
  _Ios_Openmode local_144;
  string local_140 [4];
  openmode omode;
  string newLineCharacters;
  undefined1 local_118 [8];
  string path;
  size_type pos;
  string *psStack_e8;
  mode_t perm;
  string *sinfile;
  string soutfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  int res;
  bool escapeQuotes_local;
  bool atOnly_local;
  bool copyonly_local;
  string *outfile_local;
  string *infile_local;
  cmMakefile *this_local;
  cmNewLineStyle newLine_local;
  
  this_local._0_4_ = newLine.NewLineStyle;
  local_30 = 1;
  local_2b = escapeQuotes;
  local_2a = atOnly;
  local_29 = copyonly;
  _res = outfile;
  outfile_local = infile;
  infile_local = (string *)this;
  bVar1 = CanIWriteThisFile(this,outfile);
  if (!bVar1) {
    std::operator+(&local_70,"Attempt to write file: ",_res);
    std::operator+(&local_50,&local_70," into a source directory.");
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    return 0;
  }
  bVar1 = cmsys::SystemTools::FileExists(outfile_local);
  if (!bVar1) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&soutfile.field_2 + 8);
    std::operator+(__return_storage_ptr__,"File ",outfile_local);
    std::operator+(&local_a0,__return_storage_ptr__," does not exist.");
    cmSystemTools::Error(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)(soutfile.field_2._M_local_buf + 8));
    return 0;
  }
  std::__cxx11::string::string((string *)&sinfile,(string *)_res);
  psStack_e8 = outfile_local;
  AddCMakeDependFile(this,outfile_local);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)&sinfile);
  AddCMakeOutputFile(this,(string *)&sinfile);
  pos._4_4_ = 0;
  cmsys::SystemTools::GetPermissions(psStack_e8,(mode_t *)((long)&pos + 4));
  path.field_2._8_8_ = std::__cxx11::string::rfind((char)&sinfile,0x2f);
  if (path.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_118,(ulong)&sinfile);
    cmsys::SystemTools::MakeDirectory((string *)local_118,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)local_118);
  }
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::string(local_140);
    local_144 = std::operator|(_S_out,_S_trunc);
    bVar1 = cmNewLineStyle::IsValid((cmNewLineStyle *)&this_local);
    if (bVar1) {
      cmNewLineStyle::GetCharacters_abi_cxx11_
                ((string *)((long)&tempOutputFile.field_2 + 8),(cmNewLineStyle *)&this_local);
      std::__cxx11::string::operator=(local_140,(string *)(tempOutputFile.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(tempOutputFile.field_2._M_local_buf + 8));
      std::operator|=(&local_144,_S_bin);
    }
    else {
      std::__cxx11::string::operator=(local_140,"\n");
    }
    std::__cxx11::string::string((string *)&fout.field_0x1f8,(string *)&sinfile);
    std::__cxx11::string::operator+=((string *)&fout.field_0x1f8,".tmp");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_388,pcVar4,local_144);
    bVar2 = std::ios::operator!((ios *)(local_388 + (long)*(_func_int **)((long)local_388 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_5b0,pcVar4,_S_in);
      bVar2 = std::ios::operator!((ios *)((long)&local_5b0 + *(long *)(local_5b0 + -0x18)));
      if ((bVar2 & 1) == 0) {
        BVar3 = cmsys::FStream::ReadBOM((istream *)&local_5b0);
        if ((BVar3 == BOM_None) || (BVar3 == BOM_UTF8)) {
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)((long)&inLine.field_2 + 8),0);
          std::istream::seekg(&local_5b0,inLine.field_2._8_8_,local_778);
          std::__cxx11::string::string((string *)(outLine.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_7c0);
          while (bVar1 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&local_5b0,(string *)((long)&outLine.field_2 + 8),
                                    (bool *)0x0,-1), bVar1) {
            std::__cxx11::string::clear();
            ConfigureString(this,(string *)((long)&outLine.field_2 + 8),(string *)local_7c0,
                            (bool)(local_2a & 1),(bool)(local_2b & 1));
            poVar5 = std::operator<<((ostream *)local_388,(string *)local_7c0);
            std::operator<<(poVar5,local_140);
          }
          std::ifstream::close();
          std::ofstream::close();
          bVar1 = cmsys::SystemTools::CopyFileIfDifferent
                            ((string *)&fout.field_0x1f8,(string *)&sinfile);
          if (bVar1) {
            cmsys::SystemTools::SetPermissions((string *)&sinfile,pos._4_4_,false);
          }
          else {
            local_30 = 0;
          }
          cmsys::SystemTools::RemoveFile((string *)&fout.field_0x1f8);
          std::__cxx11::string::~string((string *)local_7c0);
          std::__cxx11::string::~string((string *)(outLine.field_2._M_local_buf + 8));
          newLineCharacters.field_2._12_4_ = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_750);
          poVar5 = std::operator<<((ostream *)local_750,
                                   "File starts with a Byte-Order-Mark that is not UTF-8:\n  ");
          std::operator<<(poVar5,(string *)psStack_e8);
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_770);
          std::__cxx11::string::~string((string *)&local_770);
          this_local._4_4_ = 0;
          newLineCharacters.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_750);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0,"Could not open file for read in copy operation ",psStack_e8);
        cmSystemTools::Error((string *)local_5d0);
        std::__cxx11::string::~string((string *)local_5d0);
        this_local._4_4_ = 0;
        newLineCharacters.field_2._12_4_ = 1;
      }
      std::ifstream::~ifstream(&local_5b0);
    }
    else {
      std::operator+(&local_3a8,"Could not open file for write in copy operation ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8);
      cmSystemTools::Error(&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      cmSystemTools::ReportLastSystemError("");
      this_local._4_4_ = 0;
      newLineCharacters.field_2._12_4_ = 1;
    }
    std::ofstream::~ofstream(local_388);
    std::__cxx11::string::~string((string *)&fout.field_0x1f8);
    std::__cxx11::string::~string(local_140);
    if (newLineCharacters.field_2._12_4_ != 0) goto LAB_00243089;
  }
  else {
    bVar1 = cmsys::SystemTools::CopyFileIfDifferent(psStack_e8,(string *)&sinfile);
    if (!bVar1) {
      this_local._4_4_ = 0;
      newLineCharacters.field_2._12_4_ = 1;
      goto LAB_00243089;
    }
  }
  this_local._4_4_ = local_30;
  newLineCharacters.field_2._12_4_ = 1;
LAB_00243089:
  std::__cxx11::string::~string((string *)&sinfile);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error("Attempt to write file: " + outfile +
                         " into a source directory.");
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error("File " + infile + " does not exist.");
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  mode_t perm = 0;
  cmSystemTools::GetPermissions(sinfile, perm);
  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = soutfile;
    tempOutputFile += ".tmp";
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      res = 0;
    } else {
      cmSystemTools::SetPermissions(soutfile, perm);
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}